

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

WirehairResult __thiscall wirehair::Codec::EncodeFeed(Codec *this,void *message_in)

{
  bool bVar1;
  long in_RSI;
  Codec *in_RDI;
  WirehairResult result;
  uint16_t id;
  Codec *in_stack_00000020;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  undefined2 in_stack_ffffffffffffffe6;
  ushort uVar2;
  WirehairResult local_4;
  
  if (in_RSI == 0) {
    local_4 = Wirehair_InvalidInput;
  }
  else {
    SetInput((Codec *)CONCAT26(in_stack_ffffffffffffffe6,
                               CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)),in_RDI
            );
    for (uVar2 = 0; uVar2 < in_RDI->_block_count; uVar2 = uVar2 + 1) {
      bVar1 = OpportunisticPeeling(in_stack_00000020,this._6_2_,(uint32_t)this);
      if (!bVar1) {
        return Wirehair_BadPeelSeed;
      }
    }
    local_4 = SolveMatrix(in_RDI);
    if (local_4 == Wirehair_Success) {
      GenerateRecoveryBlocks((Codec *)((ulong)CONCAT22(uVar2,in_stack_ffffffffffffffe4) << 0x20));
      local_4 = Wirehair_Success;
    }
    else if (local_4 == Wirehair_NeedMore) {
      local_4 = Wirehair_BadPeelSeed;
    }
  }
  return local_4;
}

Assistant:

WirehairResult Codec::EncodeFeed(const void * GF256_RESTRICT message_in)
{
    CAT_IF_DUMP(cout << endl << "---- EncodeFeed ----" << endl << endl;)

    // Validate input
    if (message_in == nullptr) {
        return Wirehair_InvalidInput;
    }

    SetInput(message_in);

    // For each input row:
    for (uint16_t id = 0; id < _block_count; ++id) {
        if (!OpportunisticPeeling(id, id)) {
            return Wirehair_BadPeelSeed;
        }
    }

    // Solve matrix and generate recovery blocks
    WirehairResult result = SolveMatrix();

    if (result == Wirehair_Success) {
        GenerateRecoveryBlocks();
        return Wirehair_Success;
    }
    else if (result == Wirehair_NeedMore) {
        return Wirehair_BadPeelSeed;
    }
    else {
        return result;
    }
}